

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void __thiscall
crsGA::Logger::log_recursive(Logger *this,LogLevel logLevel,char *file,int line,ostringstream *msg)

{
  double __x;
  string local_50 [32];
  ostringstream *local_30;
  ostringstream *msg_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  Logger *pLStack_10;
  LogLevel logLevel_local;
  Logger *this_local;
  
  local_30 = msg;
  msg_local._4_4_ = line;
  pcStack_20 = file;
  file_local._4_4_ = logLevel;
  pLStack_10 = this;
  __x = (double)std::__cxx11::ostringstream::str();
  log(this,__x);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void log_recursive(LogLevel logLevel, const char* file, int line, std::ostringstream& msg)
        {
            log(logLevel, file, line, msg.str());
        }